

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_pkits_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_17::CrlCheckingPathBuilderDelegate::CheckPathAfterVerification
          (CrlCheckingPathBuilderDelegate *this,CertPathBuilder *path_builder,
          CertPathBuilderResultPath *path)

{
  optional<long> max_age_seconds;
  undefined8 target_cert_index;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *this_01;
  char *message;
  ParsedDistributionPoint *pPVar4;
  CertErrors *pCVar5;
  ParsedExtension *parsed_extension;
  char *in_R9;
  string_view sVar6;
  Input extension_value;
  _Storage<long,_true> local_1d0;
  undefined8 uStack_1c8;
  string_view local_1c0;
  CRLRevocationStatus local_1ac;
  reference pbStack_1a8;
  CRLRevocationStatus crl_status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *der_crl;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool cert_good;
  ParsedDistributionPoint *dp;
  iterator __end4;
  iterator __begin4;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> *__range4;
  string local_158;
  AssertHelper local_138;
  Message local_130;
  size_t local_128;
  uchar *puStack_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  Span<const_unsigned_char> local_f0 [2];
  undefined1 local_d0 [8];
  ParsedExtension crl_dp_extension;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
  distribution_points;
  ParsedDistributionPoint *cert_dp;
  ParsedDistributionPoint fake_cert_dp;
  size_t i;
  size_t reverse_i;
  ParsedCertificateList *certs;
  CertPathBuilderResultPath *path_local;
  CertPathBuilder *path_builder_local;
  CrlCheckingPathBuilderDelegate *this_local;
  
  SimplePathBuilderDelegate::CheckPathAfterVerification
            (&this->super_SimplePathBuilderDelegate,path_builder,path);
  bVar1 = CertPathBuilderResultPath::IsValid(path);
  if (bVar1) {
    i = 0;
    while( true ) {
      sVar3 = ::std::
              vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              ::size(&path->certs);
      if (sVar3 <= i) break;
      sVar3 = ::std::
              vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              ::size(&path->certs);
      fake_cert_dp.crl_issuer.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
      super__Optional_payload_base<bssl::der::Input>._16_8_ = (sVar3 - i) + -1;
      if (i == 0) {
        bVar1 = CertificateTrust::IsTrustAnchor(&path->last_cert_trust);
        if (!bVar1) goto LAB_0031639c;
      }
      else {
LAB_0031639c:
        distribution_points.
        super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&cert_dp;
        ParsedDistributionPoint::ParsedDistributionPoint
                  (distribution_points.
                   super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ::vector((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                  *)&crl_dp_extension.critical);
        ParsedExtension::ParsedExtension((ParsedExtension *)local_d0);
        this_00 = (__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)::std::
                     vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                     ::operator[](&path->certs,
                                  fake_cert_dp.crl_issuer.
                                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                                  super__Optional_payload_base<bssl::der::Input>._16_8_);
        this_01 = ::std::
                  __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(this_00);
        Span<unsigned_char_const>::Span<3ul>
                  ((Span<unsigned_char_const> *)&gtest_ar_.message_,
                   (uchar (*) [3])&kCrlDistributionPointsOid);
        bssl::der::Input::Input((Input *)local_f0,stack0xffffffffffffff00);
        parsed_extension = (ParsedExtension *)local_d0;
        bVar1 = ParsedCertificate::GetExtension(this_01,(Input)local_f0[0],parsed_extension);
        if (bVar1) {
          local_128 = crl_dp_extension.oid.data_.size_;
          puStack_120 = crl_dp_extension.value.data_.data_;
          extension_value.data_.size_ = (size_t)&crl_dp_extension.critical;
          extension_value.data_.data_ = crl_dp_extension.value.data_.data_;
          local_111 = ParseCrlDistributionPoints
                                ((bssl *)crl_dp_extension.oid.data_.size_,extension_value,
                                 (vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                                  *)parsed_extension);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_110,&local_111,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
          if (!bVar1) {
            testing::Message::Message(&local_130);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_158,(internal *)local_110,
                       (AssertionResult *)
                       "ParseCrlDistributionPoints(crl_dp_extension.value, &distribution_points)",
                       "false","true",in_R9);
            message = (char *)::std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_138,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_pkits_unittest.cc"
                       ,0x58,message);
            testing::internal::AssertHelper::operator=(&local_138,&local_130);
            testing::internal::AssertHelper::~AssertHelper(&local_138);
            ::std::__cxx11::string::~string((string *)&local_158);
            testing::Message::~Message(&local_130);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
          if (!bVar1) {
            __end4 = ::std::
                     vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                     ::begin((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                              *)&crl_dp_extension.critical);
            dp = (ParsedDistributionPoint *)
                 ::std::
                 vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                 ::end((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                        *)&crl_dp_extension.critical);
            while( true ) {
              bVar1 = __gnu_cxx::operator!=
                                (&__end4,(__normal_iterator<bssl::ParsedDistributionPoint_*,_std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>_>
                                          *)&dp);
              pPVar4 = distribution_points.
                       super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (!bVar1) break;
              pPVar4 = __gnu_cxx::
                       __normal_iterator<bssl::ParsedDistributionPoint_*,_std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>_>
                       ::operator*(&__end4);
              bVar1 = ::std::optional::operator_cast_to_bool((optional *)&pPVar4->reasons);
              if (!bVar1) break;
              __gnu_cxx::
              __normal_iterator<bssl::ParsedDistributionPoint_*,_std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>_>
              ::operator++(&__end4);
            }
            distribution_points.
            super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar4;
            if (distribution_points.
                super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)&cert_dp) {
              bVar1 = ::std::
                      vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                      ::empty((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                               *)&crl_dp_extension.critical);
              if (!bVar1) {
                distribution_points.
                super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     ::std::
                     vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                     ::operator[]((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                                   *)&crl_dp_extension.critical,0);
              }
            }
            goto LAB_00316707;
          }
        }
        else {
LAB_00316707:
          bVar1 = false;
          __end3 = ::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->der_crls_);
          der_crl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(&this->der_crls_);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&der_crl);
            if (!bVar2) break;
            pbStack_1a8 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&__end3);
            sVar6 = (string_view)
                    ::std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)pbStack_1a8);
            target_cert_index =
                 fake_cert_dp.crl_issuer.super__Optional_base<bssl::der::Input,_true,_true>.
                 _M_payload.super__Optional_payload_base<bssl::der::Input>._16_8_;
            in_R9 = (char *)this->verify_time_;
            local_1c0 = sVar6;
            ::std::optional<long>::optional<long_&,_true>
                      ((optional<long> *)&local_1d0,&this->max_age_);
            max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._8_8_ = uStack_1c8;
            max_age_seconds.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._M_value = local_1d0._M_value;
            local_1ac = CheckCRL(local_1c0,&path->certs,target_cert_index,
                                 distribution_points.
                                 super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(int64_t)in_R9,
                                 max_age_seconds);
            if (local_1ac == REVOKED) {
              pCVar5 = CertPathErrors::GetErrorsForCert
                                 (&path->errors,
                                  fake_cert_dp.crl_issuer.
                                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                                  super__Optional_payload_base<bssl::der::Input>._16_8_);
              CertErrors::AddError(pCVar5,"Certificate is revoked");
              bVar1 = true;
              goto LAB_003168d8;
            }
            if (local_1ac == GOOD) {
              bVar1 = true;
              break;
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          if (!bVar1) {
            pCVar5 = CertPathErrors::GetErrorsForCert
                               (&path->errors,
                                fake_cert_dp.crl_issuer.
                                super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                                super__Optional_payload_base<bssl::der::Input>._16_8_);
            CertErrors::AddError(pCVar5,"Unable to check revocation");
          }
          bVar1 = false;
        }
LAB_003168d8:
        ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ::~vector((vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
                   *)&crl_dp_extension.critical);
        ParsedDistributionPoint::~ParsedDistributionPoint((ParsedDistributionPoint *)&cert_dp);
        if (bVar1) {
          return;
        }
      }
      i = i + 1;
    }
  }
  return;
}

Assistant:

void CheckPathAfterVerification(const CertPathBuilder &path_builder,
                                  CertPathBuilderResultPath *path) override {
    SimplePathBuilderDelegate::CheckPathAfterVerification(path_builder, path);

    if (!path->IsValid()) {
      return;
    }

    // It would be preferable if this test could use
    // CheckValidatedChainRevocation somehow, but that only supports getting
    // CRLs by http distributionPoints. So this just settles for writing a
    // little bit of wrapper code to test CheckCRL directly.
    const ParsedCertificateList &certs = path->certs;
    for (size_t reverse_i = 0; reverse_i < certs.size(); ++reverse_i) {
      size_t i = certs.size() - reverse_i - 1;

      // Trust anchors bypass OCSP/CRL revocation checks. (The only way to
      // revoke trust anchors is via CRLSet or the built-in SPKI block list).
      if (reverse_i == 0 && path->last_cert_trust.IsTrustAnchor()) {
        continue;
      }

      // RFC 5280 6.3.3.  [If the CRL was not specified in a distribution
      //                  point], assume a DP with both the reasons and the
      //                  cRLIssuer fields omitted and a distribution point
      //                  name of the certificate issuer.
      // Since this implementation only supports URI names in distribution
      // points, this means a default-initialized ParsedDistributionPoint is
      // sufficient.
      ParsedDistributionPoint fake_cert_dp;
      const ParsedDistributionPoint *cert_dp = &fake_cert_dp;

      // If the target cert does have a distribution point, use it.
      std::vector<ParsedDistributionPoint> distribution_points;
      ParsedExtension crl_dp_extension;
      if (certs[i]->GetExtension(der::Input(kCrlDistributionPointsOid),
                                 &crl_dp_extension)) {
        ASSERT_TRUE(ParseCrlDistributionPoints(crl_dp_extension.value,
                                               &distribution_points));
        // TODO(mattm): some test cases (some of the 4.14.* onlySomeReasons
        // tests)) have two CRLs and two distribution points, one point
        // corresponding to each CRL.  Should select the matching point for
        // each CRL.  (Doesn't matter currently since we don't support
        // reasons.)

        // Look for a DistributionPoint without reasons.
        for (const auto &dp : distribution_points) {
          if (!dp.reasons) {
            cert_dp = &dp;
            break;
          }
        }
        // If there were only DistributionPoints with reasons, just use the
        // first one.
        if (cert_dp == &fake_cert_dp && !distribution_points.empty()) {
          cert_dp = &distribution_points[0];
        }
      }

      bool cert_good = false;

      for (const auto &der_crl : der_crls_) {
        CRLRevocationStatus crl_status =
            CheckCRL(der_crl, certs, i, *cert_dp, verify_time_, max_age_);
        if (crl_status == CRLRevocationStatus::REVOKED) {
          path->errors.GetErrorsForCert(i)->AddError(
              cert_errors::kCertificateRevoked);
          return;
        }
        if (crl_status == CRLRevocationStatus::GOOD) {
          cert_good = true;
          break;
        }
      }
      if (!cert_good) {
        // PKITS tests assume hard-fail revocation checking.
        // From PKITS 4.4: "When running the tests in this section, the
        // application should be configured in such a way that the
        // certification path is not accepted unless valid, up-to-date
        // revocation data is available for every certificate in the path."
        path->errors.GetErrorsForCert(i)->AddError(
            cert_errors::kUnableToCheckRevocation);
      }
    }
  }